

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O0

long days_untill_month(Month month,uint32_t year)

{
  int *piVar1;
  ulong local_28;
  size_t i;
  int *months;
  long days;
  uint32_t year_local;
  Month month_local;
  
  months = (int *)0x0;
  piVar1 = days_in_months(year);
  for (local_28 = 0; local_28 < (long)(int)month - 1U; local_28 = local_28 + 1) {
    months = (int *)((long)piVar1[local_28] + (long)months);
  }
  return (long)months;
}

Assistant:

long days_untill_month(Month month, uint32_t year)
{
	long days{ 0 };
	int* months = days_in_months(year);
	for (size_t i = 0; i < (size_t(month) - 1); ++i)
	{
		days += months[i];
	}
	return days;
}